

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O3

void __thiscall Clone_resetWithTestVariable_Test::TestBody(Clone_resetWithTestVariable_Test *this)

{
  string *psVar1;
  ResetPtr r;
  ResetPtr rClone;
  VariablePtr v;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  long local_30 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Reset::create();
  libcellml::Variable::create();
  psVar1 = local_50;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unique","");
  libcellml::Entity::setId(psVar1);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  libcellml::Reset::setOrder((int)local_50);
  libcellml::Reset::setTestVariable((shared_ptr *)local_50);
  libcellml::Reset::clone();
  compareReset((shared_ptr *)&local_50,(shared_ptr *)&local_40);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

TEST(Clone, resetWithTestVariable)
{
    auto r = libcellml::Reset::create();
    auto v = libcellml::Variable::create();

    r->setId("unique");
    r->setOrder(43);
    r->setTestVariable(v);

    auto rClone = r->clone();

    compareReset(r, rClone);
}